

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateTessCoordAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  _Rb_tree_color execution_model;
  bool bVar1;
  StorageClass SVar2;
  _Rb_tree_node_base *p_Var3;
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  *__position;
  undefined8 *puVar4;
  spv_result_t sVar5;
  undefined1 *puVar6;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  string local_248;
  string local_228;
  undefined1 local_208 [16];
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  local_1f8;
  BuiltInsValidator *local_c0;
  spv_result_t local_38;
  
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    SVar2 = GetStorageClass((anon_unknown_0 *)
                            (referenced_from_inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (Instruction *)(ulong)(referenced_from_inst->inst_).opcode);
    if ((SVar2 != Input) && (SVar2 != Max)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_268,this->_,0x1124,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_268._M_unused._0_8_,local_268._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "Vulkan spec allows BuiltIn TessCoord to be only used for variables with Input storage class. "
                 ,0x5d);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                 ExecutionModelMax);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                  (uint32_t)local_248._M_dataplus._M_p),local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," ",1);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_228,this,referenced_from_inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      puVar6 = (undefined1 *)
               CONCAT44(local_248._M_dataplus._M_p._4_4_,(uint32_t)local_248._M_dataplus._M_p);
      sVar5 = local_38;
LAB_0064021f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6 != &local_248.field_2) {
        operator_delete(puVar6,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((code **)local_268._M_unused._0_8_ != &local_258) {
        operator_delete(local_268._M_unused._M_object,(ulong)(local_258 + 1));
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      return sVar5;
    }
    for (p_Var3 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      execution_model = p_Var3[1]._M_color;
      if (execution_model != 2) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst
                  );
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_268,this->_,0x1123,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_268._M_unused._0_8_,local_268._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "Vulkan spec allows BuiltIn TessCoord to be used only with TessellationEvaluation execution model. "
                   ,0x62);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                   execution_model);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_248._M_dataplus._M_p._4_4_,
                                    (uint32_t)local_248._M_dataplus._M_p),local_248._M_string_length
                  );
        puVar6 = (undefined1 *)
                 CONCAT44(local_248._M_dataplus._M_p._4_4_,(uint32_t)local_248._M_dataplus._M_p);
        sVar5 = local_38;
        goto LAB_0064021f;
      }
    }
  }
  if (this->function_id_ == 0) {
    local_248._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
    __position = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                  *)std::
                    map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                    ::operator[](&this->id_to_at_reference_checks_,(key_type *)&local_248);
    local_208._0_8_ = ValidateTessCoordAtReference;
    local_208._8_8_ = 0;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl(&local_1f8,decoration,built_in_inst,referenced_from_inst,
                  (_Placeholder<1> *)&std::placeholders::_1);
    local_268._8_8_ = 0;
    local_c0 = this;
    puVar4 = (undefined8 *)operator_new(0x150);
    *puVar4 = local_208._0_8_;
    puVar4[1] = local_208._8_8_;
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                   *)(puVar4 + 2),&local_1f8);
    puVar4[0x29] = local_c0;
    local_250 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_invoke;
    local_258 = std::
                _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
                ::_M_manager;
    local_268._M_unused._M_object = puVar4;
    std::__cxx11::
    list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
    ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
              (__position,(iterator)__position,
               (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_268);
    if (local_258 != (code *)0x0) {
      (*local_258)(&local_268,&local_268,3);
    }
    if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl
                      .params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                            _M_head_impl.params_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            uses_.
                            super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                      operands_.
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            operands_.
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f8.
        super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
        .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
        super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .
                            super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                            .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                            words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateTessCoordAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4388)
             << "Vulkan spec allows BuiltIn TessCoord to be only used for "
                "variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::TessellationEvaluation) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4387)
               << "Vulkan spec allows BuiltIn TessCoord to be used only with "
                  "TessellationEvaluation execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateTessCoordAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}